

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9ValidRequireExplicitPolicyTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section9ValidRequireExplicitPolicyTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.9.4";
  local_88.should_validate = true;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006ba070,(char *(*) [6])&PTR_anon_var_dwarf_3f4b94_006ba0a0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9ValidRequireExplicitPolicyTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy0CACert",
                               "requireExplicitPolicy0subCACert",
                               "requireExplicitPolicy0subsubCACert",
                               "requireExplicitPolicy0subsubsubCACert",
                               "ValidrequireExplicitPolicyTest4EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "requireExplicitPolicy0CACRL",
      "requireExplicitPolicy0subCACRL", "requireExplicitPolicy0subsubCACRL",
      "requireExplicitPolicy0subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.4";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}